

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteSpherical::ConstraintsBiLoad_C
          (ChLinkRevoluteSpherical *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 != '\0') {
    dVar5 = (this->m_cur_dist - this->m_dist) * factor;
    if (do_clamp) {
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = recovery_clamp;
      auVar1._8_8_ = 0x8000000000000000;
      auVar1._0_8_ = 0x8000000000000000;
      auVar4 = vxorpd_avx512vl(auVar2,auVar1);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar5;
      auVar1 = vmaxsd_avx(auVar6,auVar4);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = factor * this->m_cur_dot;
      auVar4 = vmaxsd_avx(auVar8,auVar4);
      auVar1 = vminsd_avx(auVar1,auVar2);
      dVar5 = auVar1._0_8_;
      auVar1 = vminsd_avx(auVar4,auVar2);
      dVar7 = auVar1._0_8_;
    }
    else {
      dVar7 = factor * this->m_cur_dot;
    }
    (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar5 + (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.b_i;
    (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar7 + (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i;
  }
  return;
}

Assistant:

void ChLinkRevoluteSpherical::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!IsActive())
        return;

    double cnstr_dist_violation = do_clamp
                                      ? ChMin(ChMax(factor * (m_cur_dist - m_dist), -recovery_clamp), recovery_clamp)
                                      : factor * (m_cur_dist - m_dist);

    double cnstr_dot_violation =
        do_clamp ? ChMin(ChMax(factor * m_cur_dot, -recovery_clamp), recovery_clamp) : factor * m_cur_dot;

    m_cnstr_dist.Set_b_i(m_cnstr_dist.Get_b_i() + cnstr_dist_violation);
    m_cnstr_dot.Set_b_i(m_cnstr_dot.Get_b_i() + cnstr_dot_violation);
}